

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend-c-api-impl.cc
# Opt level: O3

QPDF_ERROR_CODE num_pages(qpdf_data qc,int *npages)

{
  QPDF_ERROR_CODE QVar1;
  undefined1 *local_38;
  undefined1 *local_30;
  code *local_28;
  code *local_20;
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  
  local_38 = local_10;
  local_30 = local_18;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/examples/extend-c-api-impl.cc:28:28)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/examples/extend-c-api-impl.cc:28:28)>
             ::_M_manager;
  QVar1 = qpdf_c_wrap();
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
num_pages(qpdf_data qc, int* npages)
{
    // Call qpdf_c_wrap to convert any exception our function might through to a QPDF_ERROR_CODE
    // and attach it to the qpdf_data object in the same way as other functions in the C API.
    return qpdf_c_wrap(qc, [&qc, &npages]() { *npages = numPages(qpdf_c_get_qpdf(qc)); });
}